

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::delete_renderbuffers(NegativeTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"GL_INVALID_VALUE is generated if n is negative.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(&ctx->super_CallLogWrapper,-1,(GLuint *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void delete_renderbuffers (NegativeTestContext& ctx)
{;
	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	ctx.glDeleteRenderbuffers(-1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}